

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.cpp
# Opt level: O2

void __thiscall
channel::channel(channel *this,int _fd,uint32_t _Sevent,Handle _read,Handle _write,
                TimeRound<channel> *_time_round)

{
  char *pcVar1;
  
  (this->super_enable_shared_from_this<channel>)._M_weak_this.
  super___weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<channel>)._M_weak_this.
  super___weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_channel = (_func_int **)&PTR__channel_0011ab20;
  this->fd = _fd;
  this->Sevent = _Sevent;
  this->read = _read;
  this->write = _write;
  this->accept_epoll = (Epoll *)0x0;
  this->attach_epoll = (Epoll *)0x0;
  this->time_round = _time_round;
  (this->wp_time_round_item).super___weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->wp_time_round_item).super___weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)
   ((long)&(this->wp_time_round_item).
           super___weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
   4) = 0;
  (this->epevent).data.ptr = (void *)0x0;
  this->max_read_write_buff_length = 0x1000;
  pcVar1 = (char *)operator_new__(0x1000);
  this->read_buff = pcVar1;
  pcVar1 = (char *)operator_new__(0x1000);
  this->write_buff = pcVar1;
  this->read_length = 0;
  this->write_length = 0;
  (this->epevent).data.fd = _fd;
  (this->epevent).events = _Sevent;
  return;
}

Assistant:

channel::channel(int _fd,uint32_t _Sevent,Handle _read,Handle _write,TimeRound<channel>* _time_round):
epevent(),fd(_fd),Sevent(_Sevent),write(_write),read(_read),attach_epoll(nullptr),accept_epoll(nullptr),time_round(_time_round)
{
    max_read_write_buff_length = 4096;
    read_buff = new char[max_read_write_buff_length];
    write_buff = new char[max_read_write_buff_length];
    read_length = 0;
    write_length = 0;
    epevent.data.fd = _fd;
    epevent.events = Sevent;
}